

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_ComputeInnerForcing
              (ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int stage,sunrealtype cdiff)

{
  sunrealtype *psVar1;
  N_Vector *pp_Var2;
  int *piVar3;
  MRIStepCoupling pMVar4;
  long lVar5;
  ulong uVar6;
  sunrealtype ****ppppsVar7;
  int iVar8;
  sunrealtype *psVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  psVar1 = step_mem->cvals;
  pp_Var2 = step_mem->Xvecs;
  if (0 < stage) {
    iVar8 = step_mem->explicit_rhs;
    iVar11 = step_mem->implicit_rhs;
    uVar6 = 0;
    iVar10 = 0;
    do {
      if ((iVar8 != 0) && (-1 < (long)step_mem->stage_map[uVar6])) {
        pp_Var2[iVar10] = step_mem->Fse[step_mem->stage_map[uVar6]];
        iVar10 = iVar10 + 1;
      }
      if ((iVar11 != 0) && (-1 < (long)step_mem->stage_map[uVar6])) {
        pp_Var2[iVar10] = step_mem->Fsi[step_mem->stage_map[uVar6]];
        iVar10 = iVar10 + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)stage != uVar6);
  }
  lVar5 = (long)step_mem->MRIC->nmat;
  if (0 < lVar5) {
    lVar12 = 0;
    do {
      iVar8 = 0;
      if (0 < stage) {
        piVar3 = step_mem->stage_map;
        uVar6 = 0;
        iVar8 = 0;
        do {
          if (-1 < piVar3[uVar6]) {
            if (step_mem->explicit_rhs == 0) {
LAB_0014734e:
              ppppsVar7 = &step_mem->MRIC->G;
LAB_00147356:
              iVar11 = 1;
              psVar9 = psVar1;
            }
            else {
              if (step_mem->implicit_rhs == 0) {
                if (step_mem->explicit_rhs == 0) goto LAB_0014734e;
                ppppsVar7 = &step_mem->MRIC->W;
                goto LAB_00147356;
              }
              pMVar4 = step_mem->MRIC;
              psVar1[iVar8] = pMVar4->W[lVar12][stage][uVar6] * (1.0 / cdiff);
              ppppsVar7 = &pMVar4->G;
              iVar11 = 2;
              psVar9 = psVar1 + 1;
            }
            psVar9[iVar8] = (*ppppsVar7)[lVar12][stage][uVar6] * (1.0 / cdiff);
            iVar8 = iVar8 + iVar11;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)stage != uVar6);
      }
      iVar8 = N_VLinearCombination(iVar8,psVar1,pp_Var2);
      if (iVar8 != 0) {
        return -0x1c;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar5);
  }
  return 0;
}

Assistant:

int mriStep_ComputeInnerForcing(SUNDIALS_MAYBE_UNUSED ARKodeMem ark_mem,
                                ARKodeMRIStepMem step_mem, int stage,
                                sunrealtype cdiff)
{
  sunrealtype rcdiff;
  int j, k, nmat, nstore, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++)
  {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++)
  {
    nstore = 0;
    for (j = 0; j < stage; j++)
    {
      if (step_mem->stage_map[j] > -1)
      {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs)
        {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
        else if (step_mem->explicit_rhs)
        {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        }
        else
        {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

#ifdef SUNDIALS_LOGGING_EXTRA_DEBUG
  for (k = 0; k < nmat; k++)
  {
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_DEBUG,
                       "ARKODE::mriStep_ComputeInnerForcing", "forcing",
                       "forcing_%i(:) =", k);
    N_VPrintFile(step_mem->stepper->forcing[k], ARK_LOGGER->debug_fp);
  }
#endif

  return (ARK_SUCCESS);
}